

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IArrayBox.cpp
# Opt level: O0

void __thiscall amrex::IArrayBox::IArrayBox(IArrayBox *this,Box *b,int n,Arena *ar)

{
  BaseFab<int> *in_RCX;
  undefined4 in_EDX;
  BaseFab<int> *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  BaseFab<int>::BaseFab
            (in_RCX,(Box *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffc8);
  *in_RDI = &PTR__IArrayBox_01aa3dc0;
  if ((do_initval & 1) != 0) {
    std::numeric_limits<int>::max();
    BaseFab<int>::setVal<(amrex::RunOn)1>(in_RSI,(int *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

IArrayBox::IArrayBox (const Box& b, int n, Arena* ar)
    : BaseFab<int>(b,n,ar)
{
#ifndef AMREX_USE_GPU
    // For debugging purposes
    if ( do_initval ) {
        setVal<RunOn::Host>(std::numeric_limits<int>::max());
    }
#endif
}